

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

bool __thiscall
cmStandardLevelResolver::GetNewRequiredStandard
          (cmStandardLevelResolver *this,string *targetName,string *feature,
          cmValue currentLangStandardValue,string *newRequiredStandard,string *error)

{
  cmMakefile *makefile;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  StandardNeeded SVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int *piVar8;
  string *__x;
  string e;
  string lang;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  lang._M_dataplus._M_p = (pointer)&lang.field_2;
  lang._M_string_length = 0;
  lang.field_2._M_local_buf[0] = '\0';
  __x = targetName;
  bVar3 = CheckCompileFeaturesAvailable(this,targetName,feature,&lang,error);
  if ((bVar3) &&
     (iVar5 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
              ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
                      *)&lang,__x),
     iVar5.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
     ._M_cur != (__node_type *)0x0)) {
    makefile = this->Makefile;
    if (currentLangStandardValue.Value == (string *)0x0) {
      newRequiredStandard->_M_string_length = 0;
      *(newRequiredStandard->_M_dataplus)._M_p = '\0';
    }
    else {
      std::__cxx11::string::_M_assign((string *)newRequiredStandard);
    }
    SVar6 = anon_unknown.dwarf_8e5dc0::StandardLevelComputer::HighestStandardNeeded
                      ((StandardLevelComputer *)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                              ._M_cur + 0x28),makefile,feature);
    if (currentLangStandardValue.Value == (string *)0x0) {
      local_90.View_._M_len = 6;
      local_90.View_._M_str = "CMAKE_";
      local_60.View_._M_str =
           *(char **)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                            ._M_cur + 0x28);
      local_60.View_._M_len =
           *(size_t *)
            ((long)iVar5.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                   ._M_cur + 0x30);
      cmStrCat<char[18]>(&e,&local_90,&local_60,(char (*) [18])"_STANDARD_DEFAULT");
      currentLangStandardValue = cmMakefile::GetDefinition(makefile,&e);
      std::__cxx11::string::~string((string *)&e);
      if ((currentLangStandardValue.Value != (string *)0x0) &&
         ((currentLangStandardValue.Value)->_M_string_length != 0)) goto LAB_0026e65d;
      _Var7._M_current =
           *(int **)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                           ._M_cur + 0x50);
      piVar8 = _Var7._M_current;
    }
    else {
LAB_0026e65d:
      uVar1 = *(undefined8 *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x48);
      uVar2 = *(undefined8 *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x50);
      iVar4 = anon_unknown.dwarf_8e5dc0::ParseStd(currentLangStandardValue.Value);
      local_90.View_._M_len = CONCAT44(local_90.View_._M_len._4_4_,iVar4);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (uVar1,uVar2);
      piVar8 = *(int **)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                               ._M_cur + 0x50);
      if (_Var7._M_current == piVar8) {
        local_90.View_._M_len = 4;
        local_90.View_._M_str = "The ";
        local_60.View_._M_str =
             *(char **)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                              ._M_cur + 0x28);
        local_60.View_._M_len =
             *(size_t *)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                     ._M_cur + 0x30);
        cmStrCat<char[31],std::__cxx11::string,char[32],std::__cxx11::string,char[3]>
                  (&e,&local_90,&local_60,(char (*) [31])"_STANDARD property on target \"",
                   targetName,(char (*) [32])"\" contained an invalid value: \"",
                   currentLangStandardValue.Value,(char (*) [3])0x615044);
        if (error == (string *)0x0) {
          cmMakefile::IssueMessage(makefile,FATAL_ERROR,&e);
        }
        else {
          std::__cxx11::string::_M_assign((string *)error);
        }
        std::__cxx11::string::~string((string *)&e);
        goto LAB_0026e7d4;
      }
    }
    bVar3 = true;
    if ((SVar6.index != -1) &&
       ((_Var7._M_current == piVar8 ||
        (_Var7._M_current <
         (int *)((((long)SVar6 << 0x20) >> 0x1e) +
                *(long *)((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                ._M_cur + 0x48)))))) {
      std::__cxx11::string::_M_assign((string *)newRequiredStandard);
    }
  }
  else {
LAB_0026e7d4:
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&lang);
  return bVar3;
}

Assistant:

bool cmStandardLevelResolver::GetNewRequiredStandard(
  const std::string& targetName, const std::string& feature,
  cmValue currentLangStandardValue, std::string& newRequiredStandard,
  std::string* error) const
{
  std::string lang;
  if (!this->CheckCompileFeaturesAvailable(targetName, feature, lang, error)) {
    return false;
  }

  auto mapping = StandardComputerMapping.find(lang);
  if (mapping != cm::cend(StandardComputerMapping)) {
    return mapping->second.GetNewRequiredStandard(
      this->Makefile, targetName, feature, currentLangStandardValue,
      newRequiredStandard, error);
  }
  return false;
}